

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressionbuilder.h
# Opt level: O0

void __thiscall
snowhouse::
ExpressionBuilder<snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<bool>_>,_snowhouse::Nil>_>
::Evaluate<bool>(ExpressionBuilder<snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<bool>_>,_snowhouse::Nil>_>
                 *this,ResultStack *result,OperatorStack *operators,bool *actual)

{
  bool *actual_local;
  OperatorStack *operators_local;
  ResultStack *result_local;
  ExpressionBuilder<snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<bool>_>,_snowhouse::Nil>_>
  *this_local;
  
  EvaluateConstraintList<snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<bool>>,snowhouse::Nil>,bool>
            (&this->m_constraint_list,result,operators,actual);
  return;
}

Assistant:

void Evaluate(ResultStack& result, OperatorStack& operators, const ActualType& actual)
    {
      EvaluateConstraintList(m_constraint_list, result, operators, actual);
    }